

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMask.cpp
# Opt level: O2

void __thiscall
chrono::ChLinkMaskLF::SetLockMask
          (ChLinkMaskLF *this,bool x,bool y,bool z,bool e0,bool e1,bool e2,bool e3)

{
  ChConstraintTwoBodies *pCVar1;
  undefined7 in_register_00000009;
  undefined3 in_register_00000011;
  undefined3 in_register_00000031;
  undefined3 in_register_00000081;
  undefined3 in_register_00000089;
  
  pCVar1 = *(this->super_ChLinkMask).constraints.
            super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  (pCVar1->super_ChConstraintTwo).super_ChConstraint.mode = CONCAT31(in_register_00000031,x);
  ChConstraint::UpdateActiveFlag((ChConstraint *)pCVar1);
  pCVar1 = (this->super_ChLinkMask).constraints.
           super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
           ._M_impl.super__Vector_impl_data._M_start[1];
  (pCVar1->super_ChConstraintTwo).super_ChConstraint.mode = CONCAT31(in_register_00000011,y);
  ChConstraint::UpdateActiveFlag((ChConstraint *)pCVar1);
  pCVar1 = (this->super_ChLinkMask).constraints.
           super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
           ._M_impl.super__Vector_impl_data._M_start[2];
  (pCVar1->super_ChConstraintTwo).super_ChConstraint.mode =
       (eChConstraintMode)CONCAT71(in_register_00000009,z);
  ChConstraint::UpdateActiveFlag((ChConstraint *)pCVar1);
  pCVar1 = (this->super_ChLinkMask).constraints.
           super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
           ._M_impl.super__Vector_impl_data._M_start[3];
  (pCVar1->super_ChConstraintTwo).super_ChConstraint.mode = CONCAT31(in_register_00000081,e0);
  ChConstraint::UpdateActiveFlag((ChConstraint *)pCVar1);
  pCVar1 = (this->super_ChLinkMask).constraints.
           super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
           ._M_impl.super__Vector_impl_data._M_start[4];
  (pCVar1->super_ChConstraintTwo).super_ChConstraint.mode = CONCAT31(in_register_00000089,e1);
  ChConstraint::UpdateActiveFlag((ChConstraint *)pCVar1);
  pCVar1 = (this->super_ChLinkMask).constraints.
           super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
           ._M_impl.super__Vector_impl_data._M_start[5];
  (pCVar1->super_ChConstraintTwo).super_ChConstraint.mode = (uint)e2;
  ChConstraint::UpdateActiveFlag((ChConstraint *)pCVar1);
  pCVar1 = (this->super_ChLinkMask).constraints.
           super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
           ._M_impl.super__Vector_impl_data._M_start[6];
  (pCVar1->super_ChConstraintTwo).super_ChConstraint.mode = (uint)e3;
  ChConstraint::UpdateActiveFlag((ChConstraint *)pCVar1);
  return;
}

Assistant:

void ChLinkMaskLF::SetLockMask(bool x, bool y, bool z, bool e0, bool e1, bool e2, bool e3) {
    if (x)
        Constr_X().SetMode(CONSTRAINT_LOCK);
    else
        Constr_X().SetMode(CONSTRAINT_FREE);

    if (y)
        Constr_Y().SetMode(CONSTRAINT_LOCK);
    else
        Constr_Y().SetMode(CONSTRAINT_FREE);

    if (z)
        Constr_Z().SetMode(CONSTRAINT_LOCK);
    else
        Constr_Z().SetMode(CONSTRAINT_FREE);

    if (e0)
        Constr_E0().SetMode(CONSTRAINT_LOCK);
    else
        Constr_E0().SetMode(CONSTRAINT_FREE);

    if (e1)
        Constr_E1().SetMode(CONSTRAINT_LOCK);
    else
        Constr_E1().SetMode(CONSTRAINT_FREE);

    if (e2)
        Constr_E2().SetMode(CONSTRAINT_LOCK);
    else
        Constr_E2().SetMode(CONSTRAINT_FREE);

    if (e3)
        Constr_E3().SetMode(CONSTRAINT_LOCK);
    else
        Constr_E3().SetMode(CONSTRAINT_FREE);
}